

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O0

string * Catch::Detail::stringify<(anonymous_namespace)::Emplaceable*>(Emplaceable **e)

{
  string *in_RDI;
  Emplaceable *in_stack_00000018;
  
  StringMaker<(anonymous_namespace)::Emplaceable_*,_void>::
  convert<(anonymous_namespace)::Emplaceable>(in_stack_00000018);
  return in_RDI;
}

Assistant:

std::string stringify(const T& e) {
            return ::Catch::StringMaker<std::remove_cv_t<std::remove_reference_t<T>>>::convert(e);
        }